

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

void update_topbar_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  wchar_t in_ECX;
  void *user_00;
  
  t = Term;
  if ((((player != (player *)0x0) && (player->race != (player_race *)0x0)) &&
      (player->class != (player_class *)0x0)) && (cave != (chunk_conflict *)0x0)) {
    Term_activate((term *)user);
    update_topbar(EVENT_MAP,data,user_00,in_ECX);
    update_statusline_aux(L'\x02',L'\0');
    Term_fresh();
    Term_activate(t);
    return;
  }
  return;
}

Assistant:

static void update_topbar_subwindow(game_event_type type,
									game_event_data *data, void *user)
{
	term *old = Term;
	term *inv_term = user;

	/* Check sanity */
	if (!(player && player->race && player->class && cave)) return;

	/* Activate */
	Term_activate(inv_term);

	update_topbar(type, data, user, 0);

	update_statusline_aux(2, 0);

	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}